

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O1

Torsion * __thiscall
OpenMD::MoleculeCreator::createTorsion
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,TorsionStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  pointer ppAVar1;
  Atom *atom4;
  pointer pcVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  int iVar6;
  TorsionType *pTVar7;
  Torsion *this_00;
  long *plVar8;
  uint base;
  Atom *atom3;
  DirectionalAtom *pDVar9;
  size_type *psVar10;
  string s;
  vector<int,_std::allocator<int>_> torsionAtoms;
  TorsionTypeParser ttParser;
  string local_148;
  undefined1 local_128 [32];
  string local_108;
  Atom *local_e8;
  Atom *local_e0;
  string local_d8;
  DirectionalAtom *local_b8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  TorsionTypeParser local_68;
  
  TorsionTypeParser::TorsionTypeParser(&local_68);
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,&stamp->members_);
  if ((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) < 9) {
    this_00 = (Torsion *)0x0;
  }
  else {
    ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_e0 = ppAVar1[(uint)*local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start];
    local_e8 = ppAVar1[(uint)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[1]];
    atom3 = ppAVar1[(uint)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[2]];
    if ((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start == 0x10) {
      atom4 = ppAVar1[(uint)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[3]];
      if (stamp->hasOverride_ == true) {
        pcVar2 = (stamp->orType_)._M_dataplus._M_p;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,pcVar2,pcVar2 + (stamp->orType_)._M_string_length);
        std::vector<double,_std::allocator<double>_>::vector(&local_80,&stamp->orPars_);
        pTVar7 = TorsionTypeParser::parseTypeAndPars(&local_68,&local_148,&local_80);
        if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        (*(local_e0->super_StuntDouble)._vptr_StuntDouble[7])(&local_148);
        (*(local_e8->super_StuntDouble)._vptr_StuntDouble[7])(local_128);
        (*(atom3->super_StuntDouble)._vptr_StuntDouble[7])(&local_108,atom3);
        (*(atom4->super_StuntDouble)._vptr_StuntDouble[7])(&local_d8,atom4);
        pTVar7 = ForceField::getTorsionType(ff,&local_148,(string *)local_128,&local_108,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((DirectionalAtom *)local_128._0_8_ != (DirectionalAtom *)(local_128 + 0x10)) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (pTVar7 == (TorsionType *)0x0) {
          (*(local_e0->super_StuntDouble)._vptr_StuntDouble[7])(&local_148);
          _Var3._M_p = local_148._M_dataplus._M_p;
          (*(local_e8->super_StuntDouble)._vptr_StuntDouble[7])(local_128);
          local_b8 = (DirectionalAtom *)local_128._0_8_;
          (*(atom3->super_StuntDouble)._vptr_StuntDouble[7])(&local_108,atom3);
          _Var5._M_p = local_108._M_dataplus._M_p;
          (*(atom4->super_StuntDouble)._vptr_StuntDouble[7])(&local_d8,atom4);
          snprintf(painCave.errMsg,2000,"Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                   _Var3._M_p,local_b8,_Var5._M_p,local_d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((DirectionalAtom *)local_128._0_8_ != (DirectionalAtom *)(local_128 + 0x10)) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          painCave.isFatal = 1;
          simError();
          pTVar7 = (TorsionType *)0x0;
        }
      }
      this_00 = (Torsion *)operator_new(0x98);
      Torsion::Torsion(this_00,local_e0,local_e8,atom3,atom4,pTVar7);
      base = (uint)atom3;
    }
    else {
      if (ppAVar1[*(uint *)&(stamp->GhostVectorSource).super_ParameterBase.field_0x2c] ==
          (Atom *)0x0) {
        local_b8 = (DirectionalAtom *)0x0;
      }
      else {
        local_b8 = (DirectionalAtom *)
                   __dynamic_cast(ppAVar1[*(uint *)&(stamp->GhostVectorSource).super_ParameterBase.
                                                    field_0x2c],&Atom::typeinfo,
                                  &DirectionalAtom::typeinfo,0);
      }
      if (local_b8 == (DirectionalAtom *)0x0) {
        builtin_strncpy(painCave.errMsg,"Can not cast Atom to DirectionalAtom",0x25);
        painCave.isFatal = 1;
        simError();
      }
      if (stamp->hasOverride_ == true) {
        pcVar2 = (stamp->orType_)._M_dataplus._M_p;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,pcVar2,pcVar2 + (stamp->orType_)._M_string_length);
        std::vector<double,_std::allocator<double>_>::vector(&local_98,&stamp->orPars_);
        pTVar7 = TorsionTypeParser::parseTypeAndPars(&local_68,&local_148,&local_98);
        if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        (*(local_e0->super_StuntDouble)._vptr_StuntDouble[7])(&local_148);
        (*(local_e8->super_StuntDouble)._vptr_StuntDouble[7])(local_128);
        (*(atom3->super_StuntDouble)._vptr_StuntDouble[7])(&local_108,atom3);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"GHOST","");
        pTVar7 = ForceField::getTorsionType(ff,&local_148,(string *)local_128,&local_108,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((DirectionalAtom *)local_128._0_8_ != (DirectionalAtom *)(local_128 + 0x10)) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (pTVar7 == (TorsionType *)0x0) {
          (*(local_e0->super_StuntDouble)._vptr_StuntDouble[7])(&local_148);
          _Var3._M_p = local_148._M_dataplus._M_p;
          (*(local_e8->super_StuntDouble)._vptr_StuntDouble[7])(local_128);
          uVar4 = local_128._0_8_;
          (*(atom3->super_StuntDouble)._vptr_StuntDouble[7])(&local_108,atom3);
          snprintf(painCave.errMsg,2000,"Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                   _Var3._M_p,uVar4,local_108._M_dataplus._M_p,"GHOST");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((DirectionalAtom *)local_128._0_8_ != (DirectionalAtom *)(local_128 + 0x10)) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          painCave.isFatal = 1;
          simError();
          pTVar7 = (TorsionType *)0x0;
        }
      }
      this_00 = (Torsion *)operator_new(0x98);
      pDVar9 = local_b8;
      GhostTorsion::GhostTorsion((GhostTorsion *)this_00,local_e0,local_e8,local_b8,pTVar7);
      base = (uint)pDVar9;
    }
    iVar6 = IndexListContainer::pop(&localIndexMan->torsionIndexContainer_);
    (this_00->super_ShortRangeInteraction).localIndex_ = iVar6;
    OpenMD_itoa_abi_cxx11_
              (&local_148,
               (OpenMD *)
               ((ulong)((long)(mol->torsions_).
                              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(mol->torsions_).
                             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3),10,base);
    pcVar2 = (mol->molStamp_->Name).data_._M_dataplus._M_p;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar2,pcVar2 + (mol->molStamp_->Name).data_._M_string_length);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_108.field_2._M_allocated_capacity = *psVar10;
      local_108.field_2._8_8_ = plVar8[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar10;
      local_108._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_108._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
    pDVar9 = (DirectionalAtom *)(plVar8 + 2);
    if ((DirectionalAtom *)*plVar8 == pDVar9) {
      local_128._16_8_ = (pDVar9->super_Atom).super_StuntDouble._vptr_StuntDouble;
      local_128._24_4_ = (undefined4)plVar8[3];
      local_128._28_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
      local_128._0_8_ = (DirectionalAtom *)(local_128 + 0x10);
    }
    else {
      local_128._16_8_ = (pDVar9->super_Atom).super_StuntDouble._vptr_StuntDouble;
      local_128._0_8_ = (DirectionalAtom *)*plVar8;
    }
    local_128._8_8_ = plVar8[1];
    *plVar8 = (long)pDVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    (*(this_00->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(this_00);
    if ((DirectionalAtom *)local_128._0_8_ != (DirectionalAtom *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  if ((uint *)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (uint *)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>_>
               *)&local_68);
  return this_00;
}

Assistant:

Torsion* MoleculeCreator::createTorsion(ForceField* ff, Molecule* mol,
                                          TorsionStamp* stamp,
                                          LocalIndexManager* localIndexMan) {
    TorsionTypeParser ttParser;
    TorsionType* torsionType = NULL;
    Torsion* torsion         = NULL;

    std::vector<int> torsionAtoms = stamp->getMembers();
    if (torsionAtoms.size() < 3) { return torsion; }

    Atom* atomA = mol->getAtomAt(torsionAtoms[0]);
    Atom* atomB = mol->getAtomAt(torsionAtoms[1]);
    Atom* atomC = mol->getAtomAt(torsionAtoms[2]);

    if (torsionAtoms.size() == 4) {
      Atom* atomD = mol->getAtomAt(torsionAtoms[3]);

      assert(atomA && atomB && atomC && atomD);

      if (stamp->hasOverride()) {
        try {
          torsionType = ttParser.parseTypeAndPars(stamp->getOverrideType(),
                                                  stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        torsionType = ff->getTorsionType(atomA->getType(), atomB->getType(),
                                         atomC->getType(), atomD->getType());
        if (torsionType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                   atomA->getType().c_str(), atomB->getType().c_str(),
                   atomC->getType().c_str(), atomD->getType().c_str());

          painCave.isFatal = 1;
          simError();
        }
      }

      torsion = new Torsion(atomA, atomB, atomC, atomD, torsionType);
    } else {
      DirectionalAtom* dAtom = dynamic_cast<DirectionalAtom*>(
          mol->getAtomAt(stamp->getGhostVectorSource()));
      if (dAtom == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not cast Atom to DirectionalAtom");
        painCave.isFatal = 1;
        simError();
      }

      if (stamp->hasOverride()) {
        try {
          torsionType = ttParser.parseTypeAndPars(stamp->getOverrideType(),
                                                  stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        torsionType = ff->getTorsionType(atomA->getType(), atomB->getType(),
                                         atomC->getType(), "GHOST");

        if (torsionType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                   atomA->getType().c_str(), atomB->getType().c_str(),
                   atomC->getType().c_str(), "GHOST");

          painCave.isFatal = 1;
          simError();
        }
      }

      torsion = new GhostTorsion(atomA, atomB, dAtom, torsionType);
    }

    // set the local index of this torsion, the global index will be set later
    torsion->setLocalIndex(localIndexMan->getNextTorsionIndex());

    // The rule for naming a torsion is: MoleculeName_Torsion_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "Torsion"
    // The third part is the index of the torsion defined in meta-data file
    // For example, Butane_Torsion_0 is a valid Torsion name in a
    // butane molecule

    std::string s = OpenMD_itoa(mol->getNTorsions(), 10);
    torsion->setName(mol->getType() + "_Torsion_" + s.c_str());
    return torsion;
  }